

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.h
# Opt level: O2

void __thiscall ArgParser::ArgParser(ArgParser *this,string *preInfo,string *postInfo)

{
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_preInfo,(string *)preInfo);
  std::__cxx11::string::string((string *)&this->m_postInfo,(string *)postInfo);
  return;
}

Assistant:

ArgParser(std::string preInfo = "", std::string postInfo = "")
        : m_preInfo(preInfo), m_postInfo(postInfo) {}